

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::describe_abi_cxx11_(WithinUlpsMatcher *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ret;
  undefined4 in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  ostream *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  ostream *in_stack_fffffffffffffe00;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"is within ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x38));
  std::operator<<(poVar1," ULPs of ");
  if (*(char *)(in_RSI + 0x40) == '\0') {
    anon_unknown_1::write<float>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    std::operator<<(local_188,'f');
  }
  else {
    anon_unknown_1::write<double>
              (in_stack_fffffffffffffe00,
               (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  std::operator<<(local_188," ([");
  if (*(char *)(in_RSI + 0x40) == '\x01') {
    anon_unknown_1::step<double>
              ((double)in_stack_fffffffffffffe00,
               (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (uint64_t)in_stack_fffffffffffffdf0);
    anon_unknown_1::write<double>
              (in_stack_fffffffffffffe00,
               (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::operator<<(local_188,", ");
    anon_unknown_1::step<double>
              ((double)in_stack_fffffffffffffe00,
               (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (uint64_t)in_stack_fffffffffffffdf0);
    anon_unknown_1::write<double>
              (in_stack_fffffffffffffe00,
               (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  else {
    anon_unknown_1::step<float>
              ((float)((ulong)in_stack_fffffffffffffdf0 >> 0x20),SUB84(in_stack_fffffffffffffdf0,0),
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    anon_unknown_1::write<float>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    std::operator<<(local_188,", ");
    poVar1 = local_188;
    anon_unknown_1::step<float>
              ((float)((ulong)poVar1 >> 0x20),SUB84(poVar1,0),
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    anon_unknown_1::write<float>((ostream *)poVar1,in_stack_fffffffffffffdec);
  }
  std::operator<<(local_188,"])");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string WithinUlpsMatcher::describe() const {
        std::stringstream ret;

        ret << "is within " << m_ulps << " ULPs of ";

        if (m_type == FloatingPointKind::Float) {
            write(ret, static_cast<float>(m_target));
            ret << 'f';
        } else {
            write(ret, m_target);
        }

        ret << " ([";
        if (m_type == FloatingPointKind::Double) {
            write(ret, step(m_target, static_cast<double>(-INFINITY), m_ulps));
            ret << ", ";
            write(ret, step(m_target, static_cast<double>( INFINITY), m_ulps));
        } else {
            // We have to cast INFINITY to float because of MinGW, see #1782
            write(ret, step(static_cast<float>(m_target), static_cast<float>(-INFINITY), m_ulps));
            ret << ", ";
            write(ret, step(static_cast<float>(m_target), static_cast<float>( INFINITY), m_ulps));
        }
        ret << "])";

        return ret.str();
    }